

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O3

void __thiscall SpookyHash::Final(SpookyHash *this,uint64 *hash1,uint64 *hash2)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  
  if (0xbf < this->m_length) {
    local_80 = this->m_state[0];
    bVar1 = this->m_remainder;
    uVar3 = this->m_state[1];
    uVar13 = this->m_state[2];
    uVar12 = this->m_state[3];
    uVar2 = this->m_state[4];
    local_78 = this->m_state[5];
    local_70 = this->m_state[6];
    local_68 = this->m_state[7];
    local_60 = this->m_state[8];
    local_58 = this->m_state[9];
    local_48 = this->m_state[0xb];
    local_50 = this->m_state[10];
    if (0x5f < bVar1) {
      bVar1 = bVar1 + 0xa0;
      local_80 = local_80 + this->m_data[0];
      uVar15 = (local_48 ^ local_80) + uVar3;
      uVar3 = uVar3 + this->m_data[1];
      uVar12 = uVar12 ^ uVar15;
      local_80 = ((local_80 >> 0x35 | local_80 * 0x800) ^ uVar3) + (uVar13 ^ local_50);
      uVar13 = (uVar13 ^ local_50) + this->m_data[2];
      uVar2 = uVar2 ^ local_80;
      uVar3 = ((uVar3 >> 0x20 | uVar3 << 0x20) ^ uVar13) + uVar12;
      uVar12 = uVar12 + this->m_data[3];
      local_78 = local_78 ^ uVar3;
      uVar13 = ((uVar13 >> 0x15 | uVar13 << 0x2b) ^ uVar12) + uVar2;
      uVar2 = uVar2 + this->m_data[4];
      uVar12 = ((uVar12 >> 0x21 | uVar12 * 0x80000000) ^ uVar2) + local_78;
      local_78 = local_78 + this->m_data[5];
      uVar2 = ((uVar2 >> 0x2f | uVar2 * 0x20000) ^ local_78) + (local_70 ^ uVar13);
      uVar9 = (local_70 ^ uVar13) + this->m_data[6];
      local_78 = ((local_78 >> 0x24 | local_78 * 0x10000000) ^ uVar9) + (local_68 ^ uVar12);
      uVar7 = (local_68 ^ uVar12) + this->m_data[7];
      local_70 = ((uVar9 >> 0x19 | uVar9 << 0x27) ^ uVar7) + (local_60 ^ uVar2);
      uVar9 = (local_60 ^ uVar2) + this->m_data[8];
      local_68 = ((uVar7 >> 7 | uVar7 << 0x39) ^ uVar9) + (local_58 ^ local_78);
      uVar7 = (local_58 ^ local_78) + this->m_data[9];
      uVar15 = uVar15 ^ local_68;
      local_60 = ((uVar9 >> 9 | uVar9 << 0x37) ^ uVar7) + (local_50 ^ local_70);
      uVar9 = (local_50 ^ local_70) + this->m_data[10];
      local_80 = local_80 ^ local_60;
      local_58 = ((uVar7 >> 10 | uVar7 << 0x36) ^ uVar9) + uVar15;
      uVar15 = uVar15 + this->m_data[0xb];
      this = (SpookyHash *)(this->m_data + 0xc);
      uVar3 = uVar3 ^ local_58;
      local_48 = uVar15 >> 0x12 | uVar15 << 0x2e;
      local_50 = ((uVar9 >> 0x2a | uVar9 * 0x400000) ^ uVar15) + local_80;
    }
    memset((void *)((long)this->m_data + (ulong)bVar1),0,0x60 - (ulong)bVar1);
    *(byte *)((long)this->m_data + 0x5f) = bVar1;
    local_80 = local_80 + this->m_data[0];
    uVar7 = (local_48 ^ local_80) + uVar3;
    uVar3 = uVar3 + this->m_data[1];
    uVar12 = uVar12 ^ uVar7;
    uVar9 = ((local_80 >> 0x35 | local_80 * 0x800) ^ uVar3) + (uVar13 ^ local_50);
    uVar15 = (uVar13 ^ local_50) + this->m_data[2];
    uVar2 = uVar2 ^ uVar9;
    uVar13 = ((uVar3 >> 0x20 | uVar3 << 0x20) ^ uVar15) + uVar12;
    uVar12 = uVar12 + this->m_data[3];
    local_78 = local_78 ^ uVar13;
    uVar15 = ((uVar15 >> 0x15 | uVar15 << 0x2b) ^ uVar12) + uVar2;
    uVar2 = uVar2 + this->m_data[4];
    local_70 = local_70 ^ uVar15;
    uVar4 = ((uVar12 >> 0x21 | uVar12 * 0x80000000) ^ uVar2) + local_78;
    local_78 = local_78 + this->m_data[5];
    local_68 = local_68 ^ uVar4;
    uVar5 = ((uVar2 >> 0x2f | uVar2 * 0x20000) ^ local_78) + local_70;
    local_70 = local_70 + this->m_data[6];
    local_60 = local_60 ^ uVar5;
    uVar6 = ((local_78 >> 0x24 | local_78 * 0x10000000) ^ local_70) + local_68;
    local_68 = local_68 + this->m_data[7];
    local_58 = local_58 ^ uVar6;
    uVar8 = ((local_70 >> 0x19 | local_70 << 0x27) ^ local_68) + local_60;
    local_60 = local_60 + this->m_data[8];
    local_50 = local_50 ^ uVar8;
    uVar10 = ((local_68 >> 7 | local_68 << 0x39) ^ local_60) + local_58;
    local_58 = local_58 + this->m_data[9];
    uVar7 = uVar7 ^ uVar10;
    uVar11 = ((local_60 >> 9 | local_60 << 0x37) ^ local_58) + local_50;
    local_50 = local_50 + this->m_data[10];
    uVar9 = uVar9 ^ uVar11;
    uVar2 = ((local_58 >> 10 | local_58 << 0x36) ^ local_50) + uVar7;
    uVar7 = uVar7 + this->m_data[0xb];
    uVar13 = uVar13 ^ uVar2;
    uVar17 = (uVar7 >> 0x12 | uVar7 << 0x2e) + uVar13;
    uVar15 = uVar15 ^ uVar17;
    uVar3 = uVar9 + uVar15;
    uVar4 = uVar4 ^ uVar3;
    uVar13 = (uVar13 >> 0x14 | uVar13 << 0x2c) + uVar4;
    uVar5 = uVar5 ^ uVar13;
    uVar12 = (uVar15 >> 0x31 | uVar15 << 0xf) + uVar5;
    uVar6 = uVar6 ^ uVar12;
    uVar15 = (uVar4 >> 0x1e | uVar4 << 0x22) + uVar6;
    uVar8 = uVar8 ^ uVar15;
    uVar5 = (uVar5 >> 0x2b | uVar5 << 0x15) + uVar8;
    uVar10 = uVar10 ^ uVar5;
    uVar6 = (uVar6 >> 0x1a | uVar6 << 0x26) + uVar10;
    uVar11 = uVar11 ^ uVar6;
    uVar8 = (uVar8 >> 0x1f | uVar8 << 0x21) + uVar11;
    uVar2 = uVar2 ^ uVar8;
    uVar10 = (uVar10 >> 0x36 | uVar10 << 10) + uVar2;
    uVar9 = ((local_50 >> 0x2a | local_50 * 0x400000) ^ uVar7) + uVar9 ^ uVar10;
    uVar11 = (uVar11 >> 0x33 | uVar11 << 0xd) + uVar9;
    uVar17 = uVar17 ^ uVar11;
    uVar7 = (uVar2 >> 0x1a | uVar2 << 0x26) + uVar17;
    uVar3 = uVar3 ^ uVar7;
    uVar16 = (uVar9 >> 0xb | uVar9 << 0x35) + uVar3;
    uVar13 = uVar13 ^ uVar16;
    uVar18 = (uVar17 >> 0x16 | uVar17 << 0x2a) + uVar13;
    uVar12 = uVar12 ^ uVar18;
    uVar17 = (uVar3 >> 10 | uVar3 << 0x36) + uVar12;
    uVar15 = uVar15 ^ uVar17;
    uVar14 = (uVar13 >> 0x14 | uVar13 << 0x2c) + uVar15;
    uVar5 = uVar5 ^ uVar14;
    uVar4 = (uVar12 >> 0x31 | uVar12 << 0xf) + uVar5;
    uVar6 = uVar6 ^ uVar4;
    uVar2 = (uVar15 >> 0x1e | uVar15 << 0x22) + uVar6;
    uVar8 = uVar8 ^ uVar2;
    uVar3 = (uVar5 >> 0x2b | uVar5 << 0x15) + uVar8;
    uVar10 = uVar10 ^ uVar3;
    uVar6 = (uVar6 >> 0x1a | uVar6 << 0x26) + uVar10;
    uVar11 = uVar11 ^ uVar6;
    uVar9 = (uVar8 >> 0x1f | uVar8 << 0x21) + uVar11;
    uVar7 = uVar7 ^ uVar9;
    uVar13 = (uVar10 >> 0x36 | uVar10 << 10) + uVar7;
    uVar16 = uVar16 ^ uVar13;
    uVar5 = (uVar11 >> 0x33 | uVar11 << 0xd) + uVar16;
    uVar18 = uVar18 ^ uVar5;
    uVar7 = (uVar7 >> 0x1a | uVar7 << 0x26) + uVar18;
    uVar17 = uVar17 ^ uVar7;
    uVar12 = (uVar16 >> 0xb | uVar16 << 0x35) + uVar17;
    uVar14 = uVar14 ^ uVar12;
    uVar10 = (uVar18 >> 0x16 | uVar18 << 0x2a) + uVar14;
    uVar4 = uVar4 ^ uVar10;
    uVar15 = (uVar17 >> 10 | uVar17 << 0x36) + uVar4;
    uVar2 = uVar2 ^ uVar15;
    uVar8 = (uVar14 >> 0x14 | uVar14 << 0x2c) + uVar2;
    uVar3 = uVar3 ^ uVar8;
    uVar6 = (uVar4 >> 0x31 | uVar4 << 0xf) + uVar3 ^ uVar6;
    uVar9 = (uVar2 >> 0x1e | uVar2 << 0x22) + uVar6 ^ uVar9;
    uVar13 = (uVar3 >> 0x2b | uVar3 << 0x15) + uVar9 ^ uVar13;
    uVar5 = (uVar6 >> 0x1a | uVar6 << 0x26) + uVar13 ^ uVar5;
    uVar7 = (uVar9 >> 0x1f | uVar9 << 0x21) + uVar5 ^ uVar7;
    uVar12 = (uVar13 >> 0x36 | uVar13 << 10) + uVar7 ^ uVar12;
    uVar15 = ((uVar5 >> 0x33 | uVar5 << 0xd) + uVar12 ^ uVar10) + (uVar7 >> 0x1a | uVar7 << 0x26) ^
             uVar15;
    *hash1 = uVar15 >> 10 | uVar15 << 0x36;
    *hash2 = (uVar12 >> 0xb | uVar12 << 0x35) + uVar15 ^ uVar8;
    return;
  }
  Short(this,this->m_length,hash1,hash2);
  return;
}

Assistant:

void SpookyHash::Final(uint64 *hash1, uint64 *hash2)
{
    // init the variables
    if (m_length < sc_bufSize)
    {
        Short( m_data, m_length, hash1, hash2);
        return;
    }
    
    const uint64 *data = (const uint64 *)m_data;
    uint8 remainder = m_remainder;
    
    uint64 h0 = m_state[0];
    uint64 h1 = m_state[1];
    uint64 h2 = m_state[2];
    uint64 h3 = m_state[3];
    uint64 h4 = m_state[4];
    uint64 h5 = m_state[5];
    uint64 h6 = m_state[6];
    uint64 h7 = m_state[7];
    uint64 h8 = m_state[8];
    uint64 h9 = m_state[9];
    uint64 h10 = m_state[10];
    uint64 h11 = m_state[11];

    if (remainder >= sc_blockSize)
    {
        // m_data can contain two blocks; handle any whole first block
        Mix(data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	data += sc_numVars;
	remainder -= sc_blockSize;
    }

    // mix in the last partial block, and the length mod sc_blockSize
    memset(&((uint8 *)data)[remainder], 0, (sc_blockSize-remainder));

    ((uint8 *)data)[sc_blockSize-1] = remainder;
    Mix(data, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    
    // do some final mixing
    End(h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);

    *hash1 = h0;
    *hash2 = h1;
}